

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cc
# Opt level: O0

bool flow::lang::TokenTraits::isOperator(Token t)

{
  bool local_9;
  Token t_local;
  
  if ((((t == Assign) || (t == Question)) || (t - And < 0xc)) ||
     ((t - HashRocket < 5 || (t - Shl < 4)))) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool TokenTraits::isOperator(Token t) {
  switch (t) {
    case Token::Assign:
    case Token::Question:
    case Token::And:
    case Token::Or:
    case Token::Xor:
    case Token::Equal:
    case Token::UnEqual:
    case Token::Less:
    case Token::Greater:
    case Token::LessOrEqual:
    case Token::GreaterOrEqual:
    case Token::PrefixMatch:
    case Token::SuffixMatch:
    case Token::RegexMatch:
    case Token::HashRocket:
    case Token::Plus:
    case Token::Minus:
    case Token::Mul:
    case Token::Div:
    case Token::Shl:
    case Token::Shr:
    case Token::Comma:
    case Token::Pow:
      return true;
    default:
      return false;
  }
}